

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
soplex::Array<soplex::SPxPricer<double>::IdxElement>::Array
          (Array<soplex::SPxPricer<double>::IdxElement> *this,int n)

{
  size_type in_RDI;
  vector<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
  *unaff_retaddr;
  
  std::
  vector<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
  ::vector((vector<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
            *)0x2a6c0b);
  std::
  vector<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
  ::resize(unaff_retaddr,in_RDI);
  return;
}

Assistant:

explicit
   Array(int n = 0)
   {
      data.resize(n);
   }